

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Gluco::OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clean
          (OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *this,int *idx)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  vec<unsigned_int> *this_00;
  uint *puVar4;
  char *pcVar5;
  int local_28;
  int local_24;
  int j;
  int i;
  vec<unsigned_int> *vec;
  int *idx_local;
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *this_local;
  
  iVar3 = toInt(*idx);
  this_00 = vec<Gluco::vec<unsigned_int>_>::operator[](&this->occs,iVar3);
  local_28 = 0;
  local_24 = 0;
  while( true ) {
    iVar3 = vec<unsigned_int>::size(this_00);
    if (iVar3 <= local_24) break;
    puVar4 = vec<unsigned_int>::operator[](this_00,local_24);
    bVar2 = SimpSolver::ClauseDeleted::operator()(&this->deleted,puVar4);
    if (!bVar2) {
      puVar4 = vec<unsigned_int>::operator[](this_00,local_24);
      uVar1 = *puVar4;
      puVar4 = vec<unsigned_int>::operator[](this_00,local_28);
      *puVar4 = uVar1;
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  }
  vec<unsigned_int>::shrink(this_00,local_24 - local_28);
  iVar3 = toInt(*idx);
  pcVar5 = vec<char>::operator[](&this->dirty,iVar3);
  *pcVar5 = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}